

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O2

size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx *dctx,ZSTD_DDict *ddict)

{
  void *pvVar1;
  size_t sVar2;
  
  if (ddict == (ZSTD_DDict *)0x0) {
    ZSTD_decompressBegin(dctx);
  }
  else {
    pvVar1 = ZSTD_DDict_dictContent(ddict);
    sVar2 = ZSTD_DDict_dictSize(ddict);
    dctx->ddictIsCold = (uint)(dctx->dictEnd != (void *)(sVar2 + (long)pvVar1));
    ZSTD_decompressBegin(dctx);
    ZSTD_copyDDictParameters(dctx,ddict);
  }
  return 0;
}

Assistant:

size_t ZSTD_decompressBegin_usingDDict(ZSTD_DCtx* dctx, const ZSTD_DDict* ddict)
{
    DEBUGLOG(4, "ZSTD_decompressBegin_usingDDict");
    assert(dctx != NULL);
    if (ddict) {
        const char* const dictStart = (const char*)ZSTD_DDict_dictContent(ddict);
        size_t const dictSize = ZSTD_DDict_dictSize(ddict);
        const void* const dictEnd = dictStart + dictSize;
        dctx->ddictIsCold = (dctx->dictEnd != dictEnd);
        DEBUGLOG(4, "DDict is %s",
                    dctx->ddictIsCold ? "~cold~" : "hot!");
    }
    FORWARD_IF_ERROR( ZSTD_decompressBegin(dctx) );
    if (ddict) {   /* NULL ddict is equivalent to no dictionary */
        ZSTD_copyDDictParameters(dctx, ddict);
    }
    return 0;
}